

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flyd_socket.cc
# Opt level: O0

void __thiscall CSocekt::~CSocekt(CSocekt *this)

{
  bool bVar1;
  iterator this_00;
  reference ppfVar2;
  undefined8 *in_RDI;
  iterator pos;
  vector<flyd_listening_s_*,_std::allocator<flyd_listening_s_*>_> *in_stack_ffffffffffffffc8;
  MutexLock *in_stack_ffffffffffffffd0;
  __normal_iterator<flyd_listening_s_**,_std::vector<flyd_listening_s_*,_std::allocator<flyd_listening_s_*>_>_>
  local_10 [2];
  
  *in_RDI = &PTR__CSocekt_00165a90;
  __gnu_cxx::
  __normal_iterator<flyd_listening_s_**,_std::vector<flyd_listening_s_*,_std::allocator<flyd_listening_s_*>_>_>
  ::__normal_iterator(local_10);
  local_10[0]._M_current =
       (flyd_listening_s **)
       std::vector<flyd_listening_s_*,_std::allocator<flyd_listening_s_*>_>::begin
                 (in_stack_ffffffffffffffc8);
  while( true ) {
    this_00 = std::vector<flyd_listening_s_*,_std::allocator<flyd_listening_s_*>_>::end
                        (in_stack_ffffffffffffffc8);
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<flyd_listening_s_**,_std::vector<flyd_listening_s_*,_std::allocator<flyd_listening_s_*>_>_>
                        *)in_stack_ffffffffffffffd0,
                       (__normal_iterator<flyd_listening_s_**,_std::vector<flyd_listening_s_*,_std::allocator<flyd_listening_s_*>_>_>
                        *)in_stack_ffffffffffffffc8);
    if (!bVar1) break;
    ppfVar2 = __gnu_cxx::
              __normal_iterator<flyd_listening_s_**,_std::vector<flyd_listening_s_*,_std::allocator<flyd_listening_s_*>_>_>
              ::operator*(local_10);
    in_stack_ffffffffffffffd0 = (MutexLock *)*ppfVar2;
    if (in_stack_ffffffffffffffd0 != (MutexLock *)0x0) {
      operator_delete(in_stack_ffffffffffffffd0);
    }
    __gnu_cxx::
    __normal_iterator<flyd_listening_s_**,_std::vector<flyd_listening_s_*,_std::allocator<flyd_listening_s_*>_>_>
    ::operator++(local_10);
  }
  std::vector<flyd_listening_s_*,_std::allocator<flyd_listening_s_*>_>::clear
            ((vector<flyd_listening_s_*,_std::allocator<flyd_listening_s_*>_> *)0x138d47);
  std::
  multimap<long,__STRUC_MSG_HEADER_*,_std::less<long>,_std::allocator<std::pair<const_long,__STRUC_MSG_HEADER_*>_>_>
  ::~multimap((multimap<long,__STRUC_MSG_HEADER_*,_std::less<long>,_std::allocator<std::pair<const_long,__STRUC_MSG_HEADER_*>_>_>
               *)0x138d58);
  muduo::MutexLock::~MutexLock(in_stack_ffffffffffffffd0);
  std::vector<CSocekt::ThreadItem_*,_std::allocator<CSocekt::ThreadItem_*>_>::~vector
            ((vector<CSocekt::ThreadItem_*,_std::allocator<CSocekt::ThreadItem_*>_> *)
             this_00._M_current);
  muduo::MutexLock::~MutexLock(in_stack_ffffffffffffffd0);
  muduo::MutexLock::~MutexLock(in_stack_ffffffffffffffd0);
  std::__cxx11::list<char_*,_std::allocator<char_*>_>::~list
            ((list<char_*,_std::allocator<char_*>_> *)0x138dad);
  std::vector<flyd_listening_s_*,_std::allocator<flyd_listening_s_*>_>::~vector
            ((vector<flyd_listening_s_*,_std::allocator<flyd_listening_s_*>_> *)this_00._M_current);
  std::__cxx11::list<flyd_connection_s_*,_std::allocator<flyd_connection_s_*>_>::~list
            ((list<flyd_connection_s_*,_std::allocator<flyd_connection_s_*>_> *)0x138dcf);
  muduo::MutexLock::~MutexLock(in_stack_ffffffffffffffd0);
  muduo::MutexLock::~MutexLock(in_stack_ffffffffffffffd0);
  std::__cxx11::list<flyd_connection_s_*,_std::allocator<flyd_connection_s_*>_>::~list
            ((list<flyd_connection_s_*,_std::allocator<flyd_connection_s_*>_> *)0x138e02);
  std::__cxx11::list<flyd_connection_s_*,_std::allocator<flyd_connection_s_*>_>::~list
            ((list<flyd_connection_s_*,_std::allocator<flyd_connection_s_*>_> *)0x138e10);
  muduo::MutexLock::~MutexLock(in_stack_ffffffffffffffd0);
  std::__cxx11::list<char_*,_std::allocator<char_*>_>::~list
            ((list<char_*,_std::allocator<char_*>_> *)0x138e2c);
  return;
}

Assistant:

CSocekt::~CSocekt()
{
    //释放必须的内存
    //(1)监听端口相关内存的释放--------
    std::vector<lp_listening_t>::iterator pos;	
	for(pos = m_ListenSocketList.begin(); pos != m_ListenSocketList.end(); ++pos) //vector
	{		
		delete (*pos); //一定要把指针指向的内存干掉，不然内存泄漏
	}//end for
	m_ListenSocketList.clear();    
    return;

}